

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.hpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DatatypeValidator::isSubstitutableBy
          (DatatypeValidator *this,DatatypeValidator *toCheck)

{
  DatatypeValidator *local_28;
  DatatypeValidator *dv;
  DatatypeValidator *toCheck_local;
  DatatypeValidator *this_local;
  
  local_28 = toCheck;
  while( true ) {
    if (local_28 == (DatatypeValidator *)0x0) {
      return false;
    }
    if (local_28 == this) break;
    local_28 = getBaseValidator(local_28);
  }
  return true;
}

Assistant:

inline bool
DatatypeValidator::isSubstitutableBy(const DatatypeValidator* const toCheck)
{
    const DatatypeValidator* dv = toCheck;

	while (dv != 0) {

        if (dv == this) {
            return true;
        }

        dv = dv->getBaseValidator();
    }

    return false;
}